

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMessageTest_FieldOptionsSupportInfAndNan_Test::
~ParseMessageTest_FieldOptionsSupportInfAndNan_Test
          (ParseMessageTest_FieldOptionsSupportInfAndNan_Test *this)

{
  ZeroCopyInputStream *pZVar1;
  
  (this->super_ParseMessageTest).super_Test._vptr_Test = (_func_int **)&PTR__ParserTest_018d8b70;
  std::
  unique_ptr<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
  ::~unique_ptr(&(this->super_ParseMessageTest).parser_);
  std::
  unique_ptr<google::protobuf::io::Tokenizer,_std::default_delete<google::protobuf::io::Tokenizer>_>
  ::~unique_ptr(&(this->super_ParseMessageTest).input_);
  pZVar1 = (this->super_ParseMessageTest).raw_input_._M_t.
           super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
           .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>._M_head_impl;
  if (pZVar1 != (ZeroCopyInputStream *)0x0) {
    (*pZVar1->_vptr_ZeroCopyInputStream[1])();
  }
  (this->super_ParseMessageTest).raw_input_._M_t.
  super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>._M_head_impl =
       (ZeroCopyInputStream *)0x0;
  DescriptorPool::~DescriptorPool(&(this->super_ParseMessageTest).pool_);
  MockErrorCollector::~MockErrorCollector
            ((MockErrorCollector *)&(this->super_ParseMessageTest).error_collector_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseMessageTest, FieldOptionsSupportInfAndNan) {
  ExpectParsesTo(
      "import \"google/protobuf/descriptor.proto\";\n"
      "extend google.protobuf.FieldOptions {\n"
      "  optional double f = 10101;\n"
      "}\n"
      "message TestMessage {\n"
      "  optional double a = 1 [(f) = inf];\n"
      "  optional double b = 2 [(f) = -inf];\n"
      "  optional double c = 3 [(f) = nan];\n"
      "  optional double d = 4 [(f) = -nan];\n"
      "}\n",

      "dependency: \"google/protobuf/descriptor.proto\""
      "extension {"
      "  name: \"f\" label: LABEL_OPTIONAL type: TYPE_DOUBLE number: 10101"
      "  extendee: \"google.protobuf.FieldOptions\""
      "}"
      "message_type {"
      "  name: \"TestMessage\""
      "  field {"
      "    name: \"a\" label: LABEL_OPTIONAL type: TYPE_DOUBLE number: 1"
      "    options{"
      "      uninterpreted_option{"
      "        name{ name_part: \"f\" is_extension: true }"
      "        identifier_value: \"inf\""
      "      }"
      "    }"
      "  }"
      "  field {"
      "    name: \"b\" label: LABEL_OPTIONAL type: TYPE_DOUBLE number: 2"
      "    options{"
      "      uninterpreted_option{"
      "        name{ name_part: \"f\" is_extension: true }"
      "        double_value: -infinity"
      "      }"
      "    }"
      "  }"
      "  field {"
      "    name: \"c\" label: LABEL_OPTIONAL type: TYPE_DOUBLE number: 3"
      "    options{"
      "      uninterpreted_option{"
      "        name{ name_part: \"f\" is_extension: true }"
      "        identifier_value: \"nan\""
      "      }"
      "    }"
      "  }"
      "  field {"
      "    name: \"d\" label: LABEL_OPTIONAL type: TYPE_DOUBLE number: 4"
      "    options{"
      "      uninterpreted_option{"
      "        name{ name_part: \"f\" is_extension: true }"
      "        double_value: nan"
      "      }"
      "    }"
      "  }"
      "}");
}